

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O1

int BiCG<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble in_ST3;
  longdouble lVar5;
  longdouble lVar6;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar7;
  longdouble in_ST6;
  longdouble lVar8;
  longdouble in_ST7;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  TPZFMatrix<long_double> alpha;
  TPZFMatrix<long_double> rho_1;
  TPZFMatrix<long_double> beta;
  TPZFMatrix<long_double> rho_2;
  TPZFMatrix<long_double> rtilde;
  TPZFMatrix<long_double> r;
  TPZFMatrix<long_double> local_780;
  TPZFMatrix<long_double> local_6f0;
  TPZFMatrix<long_double> local_660;
  TPZFMatrix<long_double> local_5d0;
  TPZFMatrix<long_double> local_540;
  TPZFMatrix<long_double> local_4b0;
  TPZFMatrix<long_double> local_420;
  TPZFMatrix<long_double> local_390;
  TPZFMatrix<long_double> local_300;
  TPZFMatrix<long_double> local_270;
  TPZFMatrix<long_double> local_1e0;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_6f0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_6f0.fElem = (longdouble *)0x0;
  local_6f0.fGiven = (longdouble *)0x0;
  local_6f0.fSize = 0;
  TPZVec<int>::TPZVec(&local_6f0.fPivot.super_TPZVec<int>,0);
  local_6f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_6f0.fPivot.super_TPZVec<int>.fStore = local_6f0.fPivot.fExtAlloc;
  local_6f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_6f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_6f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_6f0.fWork.fStore = (longdouble *)0x0;
  local_6f0.fWork.fNElements = 0;
  local_6f0.fWork.fNAlloc = 0;
  local_6f0.fElem = (longdouble *)operator_new__(0x10);
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_5d0.fElem = (longdouble *)0x0;
  local_5d0.fGiven = (longdouble *)0x0;
  local_5d0.fSize = 0;
  TPZVec<int>::TPZVec(&local_5d0.fPivot.super_TPZVec<int>,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_5d0.fWork.fStore = (longdouble *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_5d0.fElem = (longdouble *)operator_new__(0x10);
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_780.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_780.fElem = (longdouble *)0x0;
  local_780.fGiven = (longdouble *)0x0;
  local_780.fSize = 0;
  TPZVec<int>::TPZVec(&local_780.fPivot.super_TPZVec<int>,0);
  local_780.fPivot.super_TPZVec<int>.fStore = local_780.fPivot.fExtAlloc;
  local_780.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_780.fPivot.super_TPZVec<int>.fNElements = 0;
  local_780.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_780.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_780.fWork.fStore = (longdouble *)0x0;
  local_780.fWork.fNElements = 0;
  local_780.fWork.fNAlloc = 0;
  local_780.fElem = (longdouble *)operator_new__(0x10);
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 1;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_660.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_660.fElem = (longdouble *)0x0;
  local_660.fGiven = (longdouble *)0x0;
  local_660.fSize = 0;
  TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
  local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
  local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_660.fPivot.super_TPZVec<int>.fNElements = 0;
  local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_660.fWork.fStore = (longdouble *)0x0;
  local_660.fWork.fNElements = 0;
  local_660.fWork.fNAlloc = 0;
  local_660.fElem = (longdouble *)operator_new__(0x10);
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_390.fElem = (longdouble *)0x0;
  local_390.fGiven = (longdouble *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_390.fWork.fStore = (longdouble *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_1e0.fElem = (longdouble *)0x0;
  local_1e0.fGiven = (longdouble *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_1e0.fWork.fStore = (longdouble *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_420.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_420.fElem = (longdouble *)0x0;
  local_420.fGiven = (longdouble *)0x0;
  local_420.fSize = 0;
  TPZVec<int>::TPZVec(&local_420.fPivot.super_TPZVec<int>,0);
  local_420.fPivot.super_TPZVec<int>.fStore = local_420.fPivot.fExtAlloc;
  local_420.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_420.fPivot.super_TPZVec<int>.fNElements = 0;
  local_420.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_420.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_420.fWork.fStore = (longdouble *)0x0;
  local_420.fWork.fNElements = 0;
  local_420.fWork.fNAlloc = 0;
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4b0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_4b0.fElem = (longdouble *)0x0;
  local_4b0.fGiven = (longdouble *)0x0;
  local_4b0.fSize = 0;
  TPZVec<int>::TPZVec(&local_4b0.fPivot.super_TPZVec<int>,0);
  local_4b0.fPivot.super_TPZVec<int>.fStore = local_4b0.fPivot.fExtAlloc;
  local_4b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_4b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_4b0.fWork.fStore = (longdouble *)0x0;
  local_4b0.fWork.fNElements = 0;
  local_4b0.fWork.fNAlloc = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_270.fElem = (longdouble *)0x0;
  local_270.fGiven = (longdouble *)0x0;
  local_270.fSize = 0;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_270.fWork.fStore = (longdouble *)0x0;
  local_270.fWork.fNElements = 0;
  iVar2 = 0;
  local_270.fWork.fNAlloc = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01845cc0;
  local_150.fElem = (longdouble *)0x0;
  local_150.fGiven = (longdouble *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b530;
  local_150.fWork.fStore = (longdouble *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  Dot<long_double>(b,b);
  lVar5 = in_ST7;
  sqrtl();
  lVar6 = lVar5;
  TPZMatrix<long_double>::operator*(&local_540,A,x);
  TPZFMatrix<long_double>::operator-(&local_300,b,&local_540);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_540);
  TPZFMatrix<long_double>::TPZFMatrix(&local_540,&local_300);
  Dot<long_double>(&local_300,&local_300);
  uVar9 = -(ulong)((double)in_ST1 == 0.0);
  dVar12 = (double)(~uVar9 & (ulong)(double)in_ST1 | uVar9 & 0x3ff0000000000000);
  lVar7 = lVar6;
  sqrtl();
  dVar10 = (double)(-(ulong)((double)in_ST3 / dVar12 <= *tol) & 0x3ff0000000000000);
  if (*tol < (double)in_ST3 / dVar12) {
    bVar1 = *max_iter < 1;
    if (0 < *max_iter) {
      lVar3 = 0;
      dVar11 = dVar10;
      do {
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_300,&local_390,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_540,&local_1e0,0);
        Dot<long_double>(&local_390,&local_540);
        *local_6f0.fElem = in_ST4;
        if (((double)in_ST4 == 0.0) && (!NAN((double)in_ST4))) {
          Dot<long_double>(&local_300,&local_300);
          sqrtl();
          dVar10 = (double)in_ST6 / dVar12;
          iVar2 = 2;
LAB_00c4f5ec:
          *tol = dVar10;
          *max_iter = lVar3 + 1;
          dVar10 = dVar11;
          break;
        }
        if (lVar3 == 0) {
          lVar8 = lVar7;
          TPZFMatrix<long_double>::operator=(&local_420,&local_390);
          TPZFMatrix<long_double>::operator=(&local_4b0,&local_1e0);
          lVar4 = in_ST7;
          in_ST4 = lVar5;
          in_ST6 = lVar7;
          in_ST7 = lVar8;
        }
        else {
          lVar4 = *local_5d0.fElem;
          *local_660.fElem = in_ST4 / lVar4;
          lVar8 = lVar7;
          TPZFMatrix<long_double>::TimesBetaPlusZ(&local_420,in_ST4 / lVar4,&local_390);
          TPZFMatrix<long_double>::TimesBetaPlusZ(&local_4b0,*local_660.fElem,&local_1e0);
          lVar4 = in_ST7;
          in_ST4 = lVar5;
          in_ST6 = lVar7;
          in_ST7 = lVar8;
        }
        TPZMatrix<long_double>::operator*(&local_c0,A,&local_420);
        TPZFMatrix<long_double>::operator=(&local_270,&local_c0);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
        iVar2 = 1;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_4b0,&local_150)
        ;
        lVar5 = *local_6f0.fElem;
        Dot<long_double>(&local_4b0,&local_270);
        *local_780.fElem = lVar5 / in_ST5;
        lVar5 = in_ST7;
        TPZFMatrix<long_double>::operator*(&local_c0,&local_420,*local_780.fElem);
        TPZFMatrix<long_double>::operator+=(x,&local_c0.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
        TPZFMatrix<long_double>::operator*(&local_c0,&local_270,*local_780.fElem);
        TPZFMatrix<long_double>::operator-=(&local_300,&local_c0.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
        TPZFMatrix<long_double>::operator*(&local_c0,&local_150,*local_780.fElem);
        TPZFMatrix<long_double>::operator-=(&local_540,&local_c0.super_TPZMatrix<long_double>);
        TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
        *local_5d0.fElem = *local_6f0.fElem;
        in_ST5 = lVar6;
        lVar6 = lVar5;
        Dot<long_double>(&local_300,&local_300);
        lVar7 = lVar6;
        sqrtl();
        dVar10 = (double)lVar4 / dVar12;
        dVar11 = dVar10;
        if (dVar10 < *tol) {
          iVar2 = 0;
          goto LAB_00c4f5ec;
        }
        lVar3 = lVar3 + 1;
        bVar1 = *max_iter <= lVar3;
      } while (lVar3 < *max_iter);
    }
    if (bVar1) {
      *tol = dVar10;
      iVar2 = 1;
    }
  }
  else {
    *tol = dVar10;
    *max_iter = 0;
    iVar2 = 0;
  }
  TPZFMatrix<long_double>::~TPZFMatrix(&local_540);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_4b0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_420);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_660);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_780);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_5d0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_6f0);
  return iVar2;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}